

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O1

int test(char *url)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  undefined8 uVar4;
  long lVar5;
  CURL *pCVar6;
  long lVar7;
  uint *puVar8;
  char *pcVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  undefined8 uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  timeval tVar18;
  int maxfd;
  int running;
  long timeout;
  timeval interval;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  int local_204;
  int local_200;
  int local_1fc;
  void *local_1f8;
  long local_1f0;
  int local_1e4;
  char *local_1e0;
  size_t local_1d8;
  timeval local_1d0;
  long local_1c0;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1d8 = strlen(url);
  local_1d8 = local_1d8 + 5;
  __ptr = malloc(local_1d8);
  tv_test_start = tutil_tvnow();
  if (__ptr == (void *)0x0) {
    curl_mfprintf(_stderr,"Not enough memory for full url\n");
    iVar2 = 0x7e;
  }
  else {
    easy[0] = (CURL *)0x0;
    easy[1] = (CURL *)0x0;
    easy[2] = (CURL *)0x0;
    sockets[0] = -1;
    sockets[1] = -1;
    sockets[2] = -1;
    iVar2 = curl_global_init(3);
    uVar14 = _stderr;
    if (iVar2 != 0) {
      uVar4 = curl_easy_strerror(iVar2);
      curl_mfprintf(uVar14,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                    ,0x79,iVar2,uVar4);
      res = iVar2;
    }
    iVar2 = res;
    uVar13 = (ulong)(uint)res;
    if (res == 0) {
      local_1f8 = __ptr;
      local_1e0 = url;
      lVar5 = curl_multi_init();
      if (lVar5 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x7f);
        res = 0x7b;
      }
      if (res == 0) {
        iVar15 = 0;
        uVar16 = 0;
        do {
          local_1f0 = -99;
          local_204 = -99;
          if (iVar15 == 0) {
            pCVar6 = (CURL *)curl_easy_init();
            easy[(int)uVar16] = pCVar6;
            if (pCVar6 == (CURL *)0x0) {
              curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x92);
              res = 0x7c;
            }
            iVar11 = 0xd;
            if (res == 0) {
              if ((int)uVar16 % 3 == 2) {
                curl_msnprintf(local_1f8,local_1d8,"%s0200",local_1e0);
                uVar3 = curl_easy_setopt(easy[(int)uVar16],0x6b,8);
                uVar14 = _stderr;
                if (uVar3 != 0) {
                  uVar4 = curl_easy_strerror(uVar3);
                  uVar10 = 0x96;
LAB_001026be:
                  uVar13 = (ulong)uVar3;
                  curl_mfprintf(uVar14,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                                ,uVar10,uVar13,uVar4);
                  res = uVar3;
                }
              }
              else {
                curl_msnprintf(local_1f8,local_1d8,"%s0100",local_1e0);
                uVar3 = curl_easy_setopt(easy[(int)uVar16],0x6b,1);
                uVar14 = _stderr;
                if (uVar3 != 0) {
                  uVar4 = curl_easy_strerror(uVar3);
                  uVar10 = 0x9a;
                  goto LAB_001026be;
                }
              }
              if (res != 0) goto LAB_0010299f;
              uVar3 = curl_easy_setopt(easy[(int)uVar16],0x4a,1);
              uVar14 = _stderr;
              if (uVar3 != 0) {
                uVar13 = (ulong)uVar3;
                uVar4 = curl_easy_strerror(uVar3);
                curl_mfprintf(uVar14,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x9c,uVar3,uVar4);
                res = uVar3;
              }
              if (res != 0) goto LAB_0010299f;
              uVar3 = curl_easy_setopt(easy[(int)uVar16],0x2712,local_1f8);
              uVar14 = _stderr;
              if (uVar3 != 0) {
                uVar13 = (ulong)uVar3;
                uVar4 = curl_easy_strerror(uVar3);
                curl_mfprintf(uVar14,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x9d,uVar3,uVar4);
                res = uVar3;
              }
              if (res != 0) goto LAB_0010299f;
              uVar3 = curl_easy_setopt(easy[(int)uVar16],0x29,1);
              uVar14 = _stderr;
              if (uVar3 != 0) {
                uVar13 = (ulong)uVar3;
                uVar4 = curl_easy_strerror(uVar3);
                curl_mfprintf(uVar14,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x9e,uVar3,uVar4);
                res = uVar3;
              }
              if (res != 0) goto LAB_0010299f;
              uVar3 = curl_easy_setopt(easy[(int)uVar16],0x50,1);
              uVar14 = _stderr;
              if (uVar3 != 0) {
                uVar13 = (ulong)uVar3;
                uVar4 = curl_easy_strerror(uVar3);
                curl_mfprintf(uVar14,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x9f,uVar3,uVar4);
                res = uVar3;
              }
              if (res != 0) goto LAB_0010299f;
              uVar3 = curl_easy_setopt(easy[(int)uVar16],0x2715,"testuser:testpass");
              uVar14 = _stderr;
              if (uVar3 != 0) {
                uVar13 = (ulong)uVar3;
                uVar4 = curl_easy_strerror(uVar3);
                curl_mfprintf(uVar14,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0xa0,uVar3,uVar4);
                res = uVar3;
              }
              if (res != 0) goto LAB_0010299f;
              uVar3 = curl_easy_setopt(easy[(int)uVar16],0x4e2b,callback);
              uVar14 = _stderr;
              if (uVar3 != 0) {
                uVar13 = (ulong)uVar3;
                uVar4 = curl_easy_strerror(uVar3);
                curl_mfprintf(uVar14,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0xa1,uVar3,uVar4);
                res = uVar3;
              }
              if (res != 0) goto LAB_0010299f;
              uVar3 = curl_easy_setopt(easy[(int)uVar16],0x2711);
              uVar14 = _stderr;
              if (uVar3 != 0) {
                uVar13 = (ulong)uVar3;
                uVar4 = curl_easy_strerror(uVar3);
                curl_mfprintf(uVar14,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0xa2,uVar3,uVar4);
                res = uVar3;
              }
              if (res != 0) goto LAB_0010299f;
              uVar3 = curl_easy_setopt(easy[(int)uVar16],0x2a,1);
              uVar14 = _stderr;
              if (uVar3 != 0) {
                uVar13 = (ulong)uVar3;
                uVar4 = curl_easy_strerror(uVar3);
                curl_mfprintf(uVar14,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0xa3,uVar3,uVar4);
                res = uVar3;
              }
              if (res == 0) {
                uVar3 = curl_multi_add_handle(lVar5,easy[(int)uVar16]);
                uVar14 = _stderr;
                if (uVar3 != 0) {
                  uVar13 = (ulong)uVar3;
                  uVar4 = curl_multi_strerror(uVar3);
                  curl_mfprintf(uVar14,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                                ,0xa5,uVar3,uVar4);
                  res = uVar3;
                }
                if (res == 0) {
                  uVar16 = uVar16 + 1;
                  iVar15 = 1;
                  goto LAB_00102447;
                }
              }
              iVar15 = 0;
            }
            else {
LAB_0010299f:
              iVar15 = 0;
            }
          }
          else {
LAB_00102447:
            uVar3 = curl_multi_perform(lVar5,&local_1fc);
            uVar14 = _stderr;
            if (uVar3 == 0) {
              if (local_1fc < 0) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0xaa);
                uVar13 = 0x7a;
                goto LAB_00102498;
              }
            }
            else {
              uVar13 = (ulong)uVar3;
              uVar4 = curl_multi_strerror(uVar3);
              curl_mfprintf(uVar14,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xaa,uVar3,uVar4);
LAB_00102498:
              res = (int)uVar13;
            }
            if (res == 0) {
              tVar18 = tutil_tvnow();
              lVar7 = tutil_tvdiff(tVar18,tv_test_start);
              if (5000 < lVar7) {
                curl_mfprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0xac);
                res = 0x7d;
              }
              if (res == 0) {
                if ((iVar15 == 2) && (local_1fc == 0)) {
                  iVar11 = 0xe;
                  iVar15 = 2;
                  goto LAB_001029a4;
                }
                local_1b8.__fds_bits[0xe] = 0;
                local_1b8.__fds_bits[0xf] = 0;
                local_1b8.__fds_bits[0xc] = 0;
                local_1b8.__fds_bits[0xd] = 0;
                local_1b8.__fds_bits[10] = 0;
                local_1b8.__fds_bits[0xb] = 0;
                local_1b8.__fds_bits[8] = 0;
                local_1b8.__fds_bits[9] = 0;
                local_1b8.__fds_bits[6] = 0;
                local_1b8.__fds_bits[7] = 0;
                local_1b8.__fds_bits[4] = 0;
                local_1b8.__fds_bits[5] = 0;
                local_1b8.__fds_bits[2] = 0;
                local_1b8.__fds_bits[3] = 0;
                local_1b8.__fds_bits[0] = 0;
                local_1b8.__fds_bits[1] = 0;
                local_b8.__fds_bits[0] = 0;
                local_b8.__fds_bits[1] = 0;
                local_b8.__fds_bits[2] = 0;
                local_b8.__fds_bits[3] = 0;
                local_b8.__fds_bits[4] = 0;
                local_b8.__fds_bits[5] = 0;
                local_b8.__fds_bits[6] = 0;
                local_b8.__fds_bits[7] = 0;
                local_b8.__fds_bits[8] = 0;
                local_b8.__fds_bits[9] = 0;
                local_b8.__fds_bits[10] = 0;
                local_b8.__fds_bits[0xb] = 0;
                local_b8.__fds_bits[0xc] = 0;
                local_b8.__fds_bits[0xd] = 0;
                local_b8.__fds_bits[0xe] = 0;
                local_b8.__fds_bits[0xf] = 0;
                local_138.__fds_bits[0] = 0;
                local_138.__fds_bits[1] = 0;
                local_138.__fds_bits[2] = 0;
                local_138.__fds_bits[3] = 0;
                local_138.__fds_bits[4] = 0;
                local_138.__fds_bits[5] = 0;
                local_138.__fds_bits[6] = 0;
                local_138.__fds_bits[7] = 0;
                local_138.__fds_bits[8] = 0;
                local_138.__fds_bits[9] = 0;
                local_138.__fds_bits[10] = 0;
                local_138.__fds_bits[0xb] = 0;
                local_138.__fds_bits[0xc] = 0;
                local_138.__fds_bits[0xd] = 0;
                local_138.__fds_bits[0xe] = 0;
                local_138.__fds_bits[0xf] = 0;
                uVar3 = curl_multi_fdset(lVar5,&local_1b8,&local_b8,&local_138,&local_204);
                uVar14 = _stderr;
                if (uVar3 == 0) {
                  if (local_204 < -1) {
                    curl_mfprintf(_stderr,
                                  "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                                  ,0xb5);
                    uVar13 = 0x7a;
                    goto LAB_00102b0f;
                  }
                }
                else {
                  uVar13 = (ulong)uVar3;
                  uVar4 = curl_multi_strerror(uVar3);
                  curl_mfprintf(uVar14,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                                ,0xb5,uVar3,uVar4);
LAB_00102b0f:
                  res = (int)uVar13;
                }
                if (res != 0) goto LAB_001025ff;
                uVar13 = 0;
                iVar2 = iVar15;
                if (-1 < local_204) {
                  local_1e4 = uVar16 - 1;
                  local_1c0 = (long)local_1e4;
                  uVar17 = 0;
                  uVar1 = 0;
                  local_200 = iVar15;
                  do {
                    uVar13 = uVar1;
                    iVar12 = (int)uVar13;
                    iVar11 = 0x5d;
                    if (((ulong)local_1b8.__fds_bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0) {
                      if (0 < (int)uVar16) {
                        lVar7 = 0;
                        do {
                          if (*(int *)((long)sockets + lVar7) == iVar12) goto LAB_00102c24;
                          lVar7 = lVar7 + 4;
                        } while ((ulong)uVar16 << 2 != lVar7);
                      }
                      if ((local_200 == 1 & ((byte)uVar17 ^ 1)) == 0) {
                        curl_mfprintf(_stderr,"Unexpected new socket\n");
                        res = 0x7e;
                        iVar11 = 0xd;
                      }
                      else {
                        iVar2 = sockets[local_1c0];
                        if (iVar2 == -1) {
                          sockets[local_1c0] = iVar12;
                          iVar11 = 0;
                          uVar17 = 1;
                        }
                        else {
                          if (iVar12 == iVar2) {
                            __assert_fail("curfd != sockets[num_handles-1]",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                                          ,0xd8,"int test(char *)");
                          }
                          curl_mfprintf(_stderr,"Handle %d wrote to socket %d then detected on %d\n"
                                        ,local_1e4,iVar2,uVar13);
                          res = 0x7e;
                          iVar11 = 0xd;
                        }
                      }
                    }
LAB_00102c24:
                    if ((iVar11 != 0x5d) && (iVar15 = local_200, iVar11 != 0)) goto LAB_001029a4;
                    uVar13 = uVar17;
                    uVar1 = (ulong)(iVar12 + 1);
                    iVar2 = local_200;
                  } while (iVar12 < local_204);
                }
                iVar15 = 2;
                if (iVar2 == 1) {
                  if (local_204 != -1 && uVar13 == 0) {
                    curl_mfprintf(_stderr,
                                  "Warning: socket did not open immediately for new handle (trying again)\n"
                                 );
                    iVar11 = 0xf;
                    iVar15 = 1;
                    goto LAB_001029a4;
                  }
                  iVar15 = (uint)(2 < (int)uVar16) * 2;
                }
                uVar3 = curl_multi_timeout(lVar5,&local_1f0);
                uVar14 = _stderr;
                if (uVar3 == 0) {
                  if (local_1f0 < -1) {
                    curl_mfprintf(_stderr,
                                  "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                                  ,0xef);
                    uVar13 = 0x73;
                    goto LAB_00102cfd;
                  }
                }
                else {
                  uVar13 = (ulong)uVar3;
                  uVar4 = curl_multi_strerror(uVar3);
                  curl_mfprintf(uVar14,"%s:%d curl_multi_timeout() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                                ,0xef,uVar3,uVar4);
LAB_00102cfd:
                  res = (int)uVar13;
                }
                if (res == 0) {
                  curl_mfprintf(_stderr,"%s:%d num_handles %d timeout %ld\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                                ,0xf4,uVar16,local_1f0);
                  if (local_1f0 == -1) {
                    local_1d0.tv_sec = 6;
                    local_1d0.tv_usec = 0;
                    if (uVar16 == 3 && local_1fc == 0) {
                      uVar16 = 3;
                      iVar11 = 0xe;
                      goto LAB_001029a4;
                    }
                  }
                  else {
                    lVar7 = local_1f0;
                    if (0x7ffffffe < local_1f0) {
                      lVar7 = 0x7fffffff;
                    }
                    local_1d0.tv_sec = (__time_t)((int)lVar7 / 1000);
                    local_1d0.tv_usec = (__suseconds_t)(((int)lVar7 % 1000) * 1000);
                  }
                  iVar2 = select_wrapper(local_204 + 1,&local_1b8,&local_b8,&local_138,&local_1d0);
                  if (iVar2 == -1) {
                    puVar8 = (uint *)__errno_location();
                    uVar14 = _stderr;
                    uVar3 = *puVar8;
                    uVar13 = (ulong)uVar3;
                    pcVar9 = strerror(uVar3);
                    curl_mfprintf(uVar14,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                                  ,0x107,uVar3,pcVar9);
                    res = 0x79;
                  }
                  if (res == 0) {
                    tVar18 = tutil_tvnow();
                    lVar7 = tutil_tvdiff(tVar18,tv_test_start);
                    if (5000 < lVar7) {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                                    ,0x109);
                      res = 0x7d;
                    }
                    iVar11 = res;
                    if (res != 0) {
                      iVar11 = 0xd;
                    }
                    goto LAB_001029a4;
                  }
                }
              }
            }
LAB_001025ff:
            iVar11 = 0xd;
          }
LAB_001029a4:
          iVar2 = (int)uVar13;
        } while ((iVar11 == 0) || (iVar11 == 0xf));
        if (1 < iVar11 - 0xdU) goto LAB_00102ff4;
      }
      lVar7 = 0;
      do {
        curl_multi_remove_handle(lVar5,*(undefined8 *)((long)easy + lVar7));
        curl_easy_cleanup(*(undefined8 *)((long)easy + lVar7));
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x18);
      curl_multi_cleanup(lVar5);
      curl_global_cleanup();
      free(local_1f8);
      iVar2 = res;
    }
    else {
      free(__ptr);
    }
  }
LAB_00102ff4:
  return iVar2;
}

Assistant:

int test(char *url)
{
  CURLM *multi = NULL;
  int running;
  int i, j;
  int num_handles = 0;
  enum HandleState state = ReadyForNewHandle;
  size_t urllen = strlen(url) + 4 + 1;
  char *full_url = malloc(urllen);

  start_test_timing();

  if(!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return TEST_ERR_MAJOR_BAD;
  }

  for(i = 0; i < MAX_EASY_HANDLES; ++i) {
    easy[i] = NULL;
    sockets[i] = CURL_SOCKET_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    free(full_url);
    return res;
  }

  multi_init(multi);

#ifdef USE_PIPELINING
  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);
  multi_setopt(multi, CURLMOPT_MAX_HOST_CONNECTIONS, 5L);
  multi_setopt(multi, CURLMOPT_MAX_TOTAL_CONNECTIONS, 10L);
#endif

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    int maxfd = -99;
    bool found_new_socket = FALSE;

    /* Start a new handle if we aren't at the max */
    if(state == ReadyForNewHandle) {
      easy_init(easy[num_handles]);

      if(num_handles % 3 == 2) {
        snprintf(full_url, urllen, "%s0200", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_NTLM);
      }
      else {
        snprintf(full_url, urllen, "%s0100", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
      }
      easy_setopt(easy[num_handles], CURLOPT_FRESH_CONNECT, 1L);
      easy_setopt(easy[num_handles], CURLOPT_URL, full_url);
      easy_setopt(easy[num_handles], CURLOPT_VERBOSE, 1L);
      easy_setopt(easy[num_handles], CURLOPT_HTTPGET, 1L);
      easy_setopt(easy[num_handles], CURLOPT_USERPWD, "testuser:testpass");
      easy_setopt(easy[num_handles], CURLOPT_WRITEFUNCTION, callback);
      easy_setopt(easy[num_handles], CURLOPT_WRITEDATA, easy + num_handles);
      easy_setopt(easy[num_handles], CURLOPT_HEADER, 1L);

      multi_add_handle(multi, easy[num_handles]);
      num_handles += 1;
      state = NeedSocketForNewHandle;
    }

    multi_perform(multi, &running);

    abort_on_test_timeout();

    if(!running && state == NoMoreHandles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    /* Any socket which is new in fdread is associated with the new handle */
    for(i = 0; i <= maxfd; ++i) {
      bool socket_exists = FALSE;
      curl_socket_t curfd = (curl_socket_t)i;

      if(!FD_ISSET(curfd, &fdread)) {
        continue;
      }

      /* Check if this socket was already detected for an earlier handle (or
         for this handle, num_handles-1, in the callback */
      for(j = 0; j < num_handles; ++j) {
        if(sockets[j] == curfd) {
          socket_exists = TRUE;
          break;
        }
      }
      if(socket_exists) {
        continue;
      }

      if(found_new_socket || state != NeedSocketForNewHandle) {
        fprintf(stderr, "Unexpected new socket\n");
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }

      /* Now we know the socket is for the most recent handle, num_handles-1 */
      if(sockets[num_handles-1] != CURL_SOCKET_BAD) {
        /* A socket for this handle was already detected in the callback; if it
           matched socket_exists should be true and we would never get here */
        assert(curfd != sockets[num_handles-1]);
        fprintf(stderr, "Handle %d wrote to socket %d then detected on %d\n",
                num_handles-1, (int)sockets[num_handles-1], (int)curfd);
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }
      else {
        sockets[num_handles-1] = curfd;
        found_new_socket = TRUE;
        /* continue to make sure there's only one new handle */
      }
    }

    if(state == NeedSocketForNewHandle) {
      if(maxfd != -1 && !found_new_socket) {
        fprintf(stderr, "Warning: socket did not open immediately for new "
                "handle (trying again)\n");
        continue;
      }
      state = num_handles < MAX_EASY_HANDLES ? ReadyForNewHandle
                                             : NoMoreHandles;
    }

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    fprintf(stderr, "%s:%d num_handles %d timeout %ld\n",
            __FILE__, __LINE__, num_handles, timeout);

    if(timeout != -1L) {
      int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
      interval.tv_sec = itimeout/1000;
      interval.tv_usec = (itimeout%1000)*1000;
    }
    else {
      interval.tv_sec = TEST_HANG_TIMEOUT/1000+1;
      interval.tv_usec = 0;

      /* if there's no timeout and we get here on the last handle, we may
         already have read the last part of the stream so waiting makes no
         sense */
      if(!running && num_handles == MAX_EASY_HANDLES) {
        break;
      }
    }

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < MAX_EASY_HANDLES; i++) {
    curl_multi_remove_handle(multi, easy[i]);
    curl_easy_cleanup(easy[i]);
  }

  curl_multi_cleanup(multi);
  curl_global_cleanup();

  free(full_url);

  return res;
}